

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O2

void __thiscall fasttext::DenseMatrix::dump(DenseMatrix *this,ostream *out)

{
  ostream *poVar1;
  real *prVar2;
  int64_t i;
  long i_00;
  int64_t j;
  long j_00;
  
  poVar1 = std::ostream::_M_insert<long>((long)out);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  for (i_00 = 0; i_00 < (this->super_Matrix).m_; i_00 = i_00 + 1) {
    for (j_00 = 0; j_00 < (this->super_Matrix).n_; j_00 = j_00 + 1) {
      if (j_00 != 0) {
        std::operator<<(out," ");
      }
      prVar2 = at(this,i_00,j_00);
      std::ostream::operator<<(out,*prVar2);
    }
    std::endl<char,std::char_traits<char>>(out);
  }
  return;
}

Assistant:

void DenseMatrix::dump(std::ostream& out) const {
  out << m_ << " " << n_ << std::endl;
  for (int64_t i = 0; i < m_; i++) {
    for (int64_t j = 0; j < n_; j++) {
      if (j > 0) {
        out << " ";
      }
      out << at(i, j);
    }
    out << std::endl;
  }
}